

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O1

int32 rw::d3d9::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  short sVar1;
  int *piVar2;
  short *psVar3;
  int iVar4;
  
  piVar2 = *(int **)((long)object + 0x98);
  iVar4 = 0;
  if ((piVar2 != (int *)0x0) && (iVar4 = 0, *piVar2 == 9)) {
    psVar3 = *(short **)(piVar2 + 0x16);
    iVar4 = piVar2[2] * 0x24 + 0x78;
    do {
      iVar4 = iVar4 + 8;
      sVar1 = *psVar3;
      psVar3 = psVar3 + 4;
    } while (sVar1 != 0xff);
    iVar4 = (piVar2[0x11] + piVar2[0xb]) * piVar2[0x19] + piVar2[0x18] * 2 + iVar4;
  }
  return iVar4;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D9)
		return 0;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	int32 size = 12 + 4 + 4 + 64 + header->numMeshes*36;
	uint32 numElt = getDeclaration(header->vertexDeclaration, nil);
	size += 4 + numElt*8;
	size += 2*header->totalNumIndex;
	size += 0x10 + header->vertexStream[0].stride*header->totalNumVertex;
	size += 0x10 + header->vertexStream[1].stride*header->totalNumVertex;
	return size;
}